

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

CLIArguments *
compile_iteration_abi_cxx11_
          (CLIArguments *args,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_file)

{
  __node_base_ptr *this;
  undefined1 uVar1;
  undefined2 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar10;
  undefined1 uVar11;
  pointer puVar3;
  undefined1 uVar14;
  undefined1 uVar15;
  uint uVar16;
  FILE *pFVar17;
  bool bVar18;
  __type _Var19;
  TypedID<(spirv_cross::Types)2> TVar20;
  CompilerCPP *pCVar21;
  ParsedIR *pPVar22;
  CompilerMSL *this_00;
  Options *__src;
  pointer *ppuVar23;
  uint *puVar24;
  MSLShaderInput *pMVar25;
  CompilerGLSL *this_01;
  pointer pCVar26;
  Rename *pRVar27;
  ulong uVar28;
  EntryPoint *pEVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  Options *pOVar32;
  pair<unsigned_int,_unsigned_int> *ppVar33;
  Options *pOVar34;
  Resource *pRVar35;
  VectorView<spirv_cross::Resource> *this_02;
  type pCVar36;
  pointer pCVar37;
  string *ts_1;
  string *ts_2;
  HLSLVertexAttributeRemap *pHVar38;
  CompilerHLSL *pCVar39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  HLSLVertexAttributeRemap *remap_2;
  HLSLVertexAttributeRemap *__end2_3;
  HLSLVertexAttributeRemap *__begin2_3;
  SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *__range2_3;
  uint32_t local_4760;
  uint32_t local_475c;
  CompilerHLSL *pCStack_4758;
  uint32_t new_builtin;
  CompilerHLSL *hlsl_compiler;
  spirv_cross local_4748 [36];
  ID local_4724;
  CombinedImageSampler *local_4720;
  CombinedImageSampler *remap_1;
  CombinedImageSampler *__end2_2;
  CombinedImageSampler *__begin2_2;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *__range2_2;
  InterfaceVariableRename *rename_1;
  InterfaceVariableRename *__end1_4;
  InterfaceVariableRename *__begin1_4;
  SmallVector<InterfaceVariableRename,_8UL> *__range1_4;
  Remap *remap;
  Remap *__end1_3;
  Remap *__begin1_3;
  SmallVector<Remap,_8UL> *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1_2;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1_2;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> local_4688;
  undefined1 local_4670 [8];
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> pls_outputs;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> pls_inputs;
  Resource *ubo_1;
  Resource *__end2_1;
  Resource *__begin2_1;
  SmallVector<spirv_cross::Resource,_8UL> *__range2_1;
  Resource *ubo;
  Resource *__end2;
  Resource *__begin2;
  SmallVector<spirv_cross::Resource,_8UL> *__range2;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  local_32d0;
  ShaderResources local_3298;
  undefined1 local_1f78 [8];
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  active;
  ShaderResources res;
  ID local_c18;
  uint32_t local_c14;
  uint32_t local_c10;
  undefined1 auStack_c0c [4];
  uint32_t sampler;
  Options hlsl_opts;
  CompilerHLSL *hlsl;
  pair<unsigned_int,_unsigned_int> *fetch;
  pair<unsigned_int,_unsigned_int> *__end1_1;
  pair<unsigned_int,_unsigned_int> *__begin1_1;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *__range1_1;
  undefined4 uStack_bd0;
  Options opts;
  EntryPoint *e_2;
  EntryPoint *__end3_7;
  EntryPoint *__begin3_7;
  SmallVector<spirv_cross::EntryPoint,_8UL> *__range3_7;
  uint32_t stage_count;
  EntryPoint *e_1;
  EntryPoint *__end3_6;
  EntryPoint *__begin3_6;
  SmallVector<spirv_cross::EntryPoint,_8UL> *__range3_6;
  bool exists;
  EntryPoint *e;
  EntryPoint *__end3_5;
  EntryPoint *__begin3_5;
  SmallVector<spirv_cross::EntryPoint,_8UL> *__range3_5;
  string local_b40 [4];
  ExecutionModel model;
  string entry_point;
  undefined1 local_b20 [8];
  SmallVector<spirv_cross::EntryPoint,_8UL> entry_points;
  Rename *rename;
  Rename *__end1;
  Rename *__begin1;
  SmallVector<CLIArguments::Rename,_8UL> *__range1;
  anon_class_8_1_89897ddb local_988;
  anon_class_8_1_89897ddb remap_cb;
  MSLShaderInput *v_4;
  MSLShaderInput *__end3_4;
  MSLShaderInput *__begin3_4;
  SmallVector<spirv_cross::MSLShaderInput,_8UL> *__range3_4;
  pair<unsigned_int,_unsigned_int> *v_3;
  pair<unsigned_int,_unsigned_int> *__end3_3;
  pair<unsigned_int,_unsigned_int> *__begin3_3;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *__range3_3;
  pair<unsigned_int,_unsigned_int> *v_2;
  pair<unsigned_int,_unsigned_int> *__end3_2;
  pair<unsigned_int,_unsigned_int> *__begin3_2;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *__range3_2;
  uint32_t i;
  uint *v_1;
  uint *__end3_1;
  uint *__begin3_1;
  SmallVector<unsigned_int,_8UL> *__range3_1;
  uint *v;
  uint *__end3;
  uint *__begin3;
  SmallVector<unsigned_int,_8UL> *__range3;
  undefined4 local_8d0;
  Options msl_opts;
  CompilerMSL *msl_comp;
  string local_860 [38];
  byte local_83a;
  byte local_839;
  bool build_dummy_sampler;
  bool combined_image_samplers;
  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_> compiler;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_820;
  undefined1 local_808 [8];
  Parser spirv_parser;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_file_local;
  CLIArguments *args_local;
  string *ret;
  undefined3 uVar8;
  undefined3 uVar9;
  undefined2 uVar12;
  undefined2 uVar13;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_820,in_RDX);
  spirv_cross::Parser::Parser
            ((Parser *)local_808,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_820);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_820);
  spirv_cross::Parser::parse((Parser *)local_808);
  std::unique_ptr<spirv_cross::CompilerGLSL,std::default_delete<spirv_cross::CompilerGLSL>>::
  unique_ptr<std::default_delete<spirv_cross::CompilerGLSL>,void>
            ((unique_ptr<spirv_cross::CompilerGLSL,std::default_delete<spirv_cross::CompilerGLSL>> *
             )&stack0xfffffffffffff7c8);
  local_839 = 0;
  local_83a = 0;
  if (((ulong)spirv_file[0xaa].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x100000000) == 0) {
    if (((ulong)spirv_file[0xab].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
      if (((ulong)spirv_file[0xab].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) == 0) {
        local_839 = (*(byte *)((long)&spirv_file[0xac].
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 4) ^ 0xff) & 1;
        if ((((ulong)spirv_file[0xac].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x100000000) == 0) ||
           (((ulong)spirv_file[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish & 1) != 0)) {
          local_83a = 1;
        }
        this_01 = (CompilerGLSL *)operator_new(0x2420);
        pPVar22 = spirv_cross::Parser::get_parsed_ir((Parser *)local_808);
        spirv_cross::CompilerGLSL::CompilerGLSL(this_01,pPVar22);
        std::unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
        ::reset((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                 *)&stack0xfffffffffffff7c8,this_01);
      }
      else {
        pCVar39 = (CompilerHLSL *)operator_new(0x2698);
        pPVar22 = spirv_cross::Parser::get_parsed_ir((Parser *)local_808);
        spirv_cross::CompilerHLSL::CompilerHLSL(pCVar39,pPVar22);
        std::unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
        ::reset((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                 *)&stack0xfffffffffffff7c8,(pointer)pCVar39);
      }
    }
    else {
      this_00 = (CompilerMSL *)operator_new(0x2b08);
      pPVar22 = spirv_cross::Parser::get_parsed_ir((Parser *)local_808);
      spirv_cross::CompilerMSL::CompilerMSL(this_00,pPVar22);
      std::unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
      reset((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
             *)&stack0xfffffffffffff7c8,(pointer)this_00);
      msl_opts._92_8_ =
           std::
           unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
           get((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                *)&stack0xfffffffffffff7c8);
      __src = spirv_cross::CompilerMSL::get_msl_options((CompilerMSL *)msl_opts._92_8_);
      memcpy((void *)((long)&__range3 + 4),__src,100);
      if (((ulong)spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish & 0x100000000000000) != 0) {
        local_8d0 = *(undefined4 *)
                     &spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
      }
      msl_opts.additional_fixed_sample_mask._0_1_ =
           *(byte *)&spirv_file[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start & 1;
      msl_opts.additional_fixed_sample_mask._1_1_ =
           *(byte *)((long)&spirv_file[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 1) & 1;
      msl_opts.view_index_from_device_index =
           (bool)(*(byte *)&spirv_file[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish & 1);
      if (((ulong)spirv_file[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start & 0x10000) != 0) {
        __range3._4_4_ = 0;
        msl_opts.multiview_layered_rendering =
             (bool)(*(byte *)((long)&spirv_file[2].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 7) & 1);
        msl_opts.dispatch_base =
             (bool)(*(byte *)((long)&spirv_file[2].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1) & 1);
      }
      msl_opts.tess_domain_origin_lower_left =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 3) & 1);
      msl_opts.additional_fixed_sample_mask._2_1_ =
           *(byte *)((long)&spirv_file[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4) & 1;
      msl_opts.capture_output_to_buffer =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 5) & 1);
      msl_opts.argument_buffers =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 6) & 1);
      msl_opts.additional_fixed_sample_mask._3_1_ =
           *(byte *)((long)&spirv_file[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 2) & 1;
      msl_opts.enable_point_size_builtin =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 3) & 1);
      msl_opts.enable_frag_depth_builtin =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 4) & 1);
      msl_opts.enable_frag_stencil_ref_builtin =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 5) & 1);
      msl_opts.texture_1D_as_2D =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 6) & 1);
      msl_opts.enable_base_index_zero =
           (bool)(*(byte *)((long)&spirv_file[2].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 7) & 1);
      msl_opts.pad_fragment_output_components =
           (bool)(*(byte *)&spirv_file[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 1);
      msl_opts.enable_frag_output_mask._1_1_ =
           *(byte *)((long)&spirv_file[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1) & 1;
      msl_opts.enable_frag_output_mask._2_1_ =
           *(byte *)((long)&spirv_file[2].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 2) & 1;
      msl_opts.shader_input_wg_index =
           *(uint32_t *)
            ((long)&spirv_file[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      msl_opts.ios_support_base_vertex_instance =
           (bool)(*(byte *)&spirv_file[3].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start & 1);
      msl_opts.ios_use_framebuffer_fetch_subpasses =
           (bool)(*(byte *)((long)&spirv_file[3].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 1) & 1);
      msl_opts.invariant_float_math =
           (bool)(*(byte *)((long)&spirv_file[3].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 2) & 1);
      msl_opts.device_index =
           *(uint32_t *)
            ((long)&spirv_file[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 4);
      msl_opts.emulate_cube_array =
           (bool)(*(byte *)&spirv_file[3].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish & 1);
      spirv_cross::CompilerMSL::set_msl_options
                ((CompilerMSL *)msl_opts._92_8_,(Options *)((long)&__range3 + 4));
      ppuVar23 = &spirv_file[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3 = spirv_cross::VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)ppuVar23);
      puVar24 = spirv_cross::VectorView<unsigned_int>::end((VectorView<unsigned_int> *)ppuVar23);
      for (; __end3 != puVar24; __end3 = __end3 + 1) {
        spirv_cross::CompilerMSL::add_discrete_descriptor_set
                  ((CompilerMSL *)msl_opts._92_8_,*__end3);
      }
      __end3_1 = spirv_cross::VectorView<unsigned_int>::begin
                           ((VectorView<unsigned_int> *)(spirv_file + 10));
      puVar24 = spirv_cross::VectorView<unsigned_int>::end
                          ((VectorView<unsigned_int> *)(spirv_file + 10));
      for (; __end3_1 != puVar24; __end3_1 = __end3_1 + 1) {
        spirv_cross::CompilerMSL::set_argument_buffer_device_address_space
                  ((CompilerMSL *)msl_opts._92_8_,*__end3_1,true);
      }
      __range3_2._4_4_ = 0;
      ppuVar23 = &spirv_file[0xc].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      __end3_2 = spirv_cross::VectorView<std::pair<unsigned_int,_unsigned_int>_>::begin
                           ((VectorView<std::pair<unsigned_int,_unsigned_int>_> *)ppuVar23);
      ppVar33 = spirv_cross::VectorView<std::pair<unsigned_int,_unsigned_int>_>::end
                          ((VectorView<std::pair<unsigned_int,_unsigned_int>_> *)ppuVar23);
      for (; __end3_2 != ppVar33; __end3_2 = __end3_2 + 1) {
        spirv_cross::CompilerMSL::add_dynamic_buffer
                  ((CompilerMSL *)msl_opts._92_8_,__end3_2->first,__end3_2->second,__range3_2._4_4_)
        ;
        __range3_2._4_4_ = __range3_2._4_4_ + 1;
      }
      __end3_3 = spirv_cross::VectorView<std::pair<unsigned_int,_unsigned_int>_>::begin
                           ((VectorView<std::pair<unsigned_int,_unsigned_int>_> *)
                            (spirv_file + 0x10));
      ppVar33 = spirv_cross::VectorView<std::pair<unsigned_int,_unsigned_int>_>::end
                          ((VectorView<std::pair<unsigned_int,_unsigned_int>_> *)(spirv_file + 0x10)
                          );
      for (; __end3_3 != ppVar33; __end3_3 = __end3_3 + 1) {
        spirv_cross::CompilerMSL::add_inline_uniform_block
                  ((CompilerMSL *)msl_opts._92_8_,__end3_3->first,__end3_3->second);
      }
      ppuVar23 = &spirv_file[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3_4 = spirv_cross::VectorView<spirv_cross::MSLShaderInput>::begin
                           ((VectorView<spirv_cross::MSLShaderInput> *)ppuVar23);
      pMVar25 = spirv_cross::VectorView<spirv_cross::MSLShaderInput>::end
                          ((VectorView<spirv_cross::MSLShaderInput> *)ppuVar23);
      for (; __end3_4 != pMVar25; __end3_4 = __end3_4 + 1) {
        remap_cb.args = (CLIArguments *)__end3_4;
        spirv_cross::CompilerMSL::add_msl_shader_input((CompilerMSL *)msl_opts._92_8_,__end3_4);
      }
    }
  }
  else {
    pCVar21 = (CompilerCPP *)operator_new(0x25a0);
    pPVar22 = spirv_cross::Parser::get_parsed_ir((Parser *)local_808);
    spirv_cross::CompilerCPP::CompilerCPP(pCVar21,pPVar22);
    std::unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
    reset((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_> *)
          &stack0xfffffffffffff7c8,(pointer)pCVar21);
    if ((spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      pCVar21 = (CompilerCPP *)
                std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::get((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                       *)&stack0xfffffffffffff7c8);
      puVar3 = (spirv_file->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_860,(char *)puVar3,(allocator *)((long)&msl_comp + 7));
      spirv_cross::CompilerCPP::set_interface_name(pCVar21,(string *)local_860);
      std::__cxx11::string::~string(local_860);
      std::allocator<char>::~allocator((allocator<char> *)((long)&msl_comp + 7));
    }
  }
  bVar18 = spirv_cross::VectorView<VariableTypeRemap>::empty
                     ((VectorView<VariableTypeRemap> *)
                      &spirv_file[0x5b].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  if (!bVar18) {
    local_988.args = (CLIArguments *)spirv_file;
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    std::
    function<void(spirv_cross::SPIRType_const&,std::__cxx11::string_const&,std::__cxx11::string&)>::
    function<compile_iteration(CLIArguments_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>)::__0,void>
              ((function<void(spirv_cross::SPIRType_const&,std::__cxx11::string_const&,std::__cxx11::string&)>
                *)&__range1,&local_988);
    spirv_cross::Compiler::set_variable_type_remap_callback
              (&pCVar26->super_Compiler,(VariableTypeRemapCallback *)&__range1);
    std::
    function<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&__range1);
  }
  __end1 = spirv_cross::VectorView<CLIArguments::Rename>::begin
                     ((VectorView<CLIArguments::Rename> *)(spirv_file + 0x91));
  pRVar27 = spirv_cross::VectorView<CLIArguments::Rename>::end
                      ((VectorView<CLIArguments::Rename> *)(spirv_file + 0x91));
  for (; __end1 != pRVar27; __end1 = __end1 + 1) {
    entry_points.stack_storage.aligned_char._312_8_ = __end1;
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    spirv_cross::Compiler::rename_entry_point
              (&pCVar26->super_Compiler,(string *)entry_points.stack_storage.aligned_char._312_8_,
               (string *)(entry_points.stack_storage.aligned_char._312_8_ + 0x20),
               *(ExecutionModel *)(entry_points.stack_storage.aligned_char._312_8_ + 0x40));
  }
  pCVar26 = std::
            unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
            operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                        *)&stack0xfffffffffffff7c8);
  spirv_cross::Compiler::get_entry_points_and_stages
            ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_b20,&pCVar26->super_Compiler);
  std::__cxx11::string::string
            (local_b40,
             (string *)
             &spirv_file[0x8e].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  __range3_5._4_4_ = ExecutionModelMax;
  uVar28 = std::__cxx11::string::empty();
  if ((uVar28 & 1) == 0) {
    __range3_5._4_4_ =
         stage_to_execution_model
                   ((string *)
                    &spirv_file[0x8f].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    uVar28 = std::__cxx11::string::empty();
    if ((uVar28 & 1) == 0) {
      bVar18 = false;
      __end3_6 = spirv_cross::VectorView<spirv_cross::EntryPoint>::begin
                           ((VectorView<spirv_cross::EntryPoint> *)local_b20);
      pEVar29 = spirv_cross::VectorView<spirv_cross::EntryPoint>::end
                          ((VectorView<spirv_cross::EntryPoint> *)local_b20);
      for (; __end3_6 != pEVar29; __end3_6 = __end3_6 + 1) {
        if ((__end3_6->execution_model == __range3_5._4_4_) &&
           (_Var19 = std::operator==(&__end3_6->name,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_b40), _Var19)) {
          bVar18 = true;
          break;
        }
      }
      pFVar17 = _stderr;
      if (!bVar18) {
        uVar30 = std::__cxx11::string::c_str();
        uVar31 = std::__cxx11::string::c_str();
        fprintf(pFVar17,"Could not find an entry point %s with stage: %s\n",uVar30,uVar31);
        exit(1);
      }
    }
    else {
      __end3_5 = spirv_cross::VectorView<spirv_cross::EntryPoint>::begin
                           ((VectorView<spirv_cross::EntryPoint> *)local_b20);
      pEVar29 = spirv_cross::VectorView<spirv_cross::EntryPoint>::end
                          ((VectorView<spirv_cross::EntryPoint> *)local_b20);
      for (; __end3_5 != pEVar29; __end3_5 = __end3_5 + 1) {
        if (__end3_5->execution_model == __range3_5._4_4_) {
          std::__cxx11::string::operator=(local_b40,(string *)__end3_5);
          break;
        }
      }
      uVar28 = std::__cxx11::string::empty();
      pFVar17 = _stderr;
      if ((uVar28 & 1) != 0) {
        uVar30 = std::__cxx11::string::c_str();
        fprintf(pFVar17,"Could not find an entry point with stage: %s\n",uVar30);
        exit(1);
      }
    }
  }
  else {
    uVar28 = std::__cxx11::string::empty();
    if ((uVar28 & 1) == 0) {
      __range3_7._4_4_ = 0;
      __end3_7 = spirv_cross::VectorView<spirv_cross::EntryPoint>::begin
                           ((VectorView<spirv_cross::EntryPoint> *)local_b20);
      pEVar29 = spirv_cross::VectorView<spirv_cross::EntryPoint>::end
                          ((VectorView<spirv_cross::EntryPoint> *)local_b20);
      for (; pFVar17 = _stderr, __end3_7 != pEVar29; __end3_7 = __end3_7 + 1) {
        opts.fragment = (FragmentOptions)__end3_7;
        _Var19 = std::operator==(&__end3_7->name,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b40);
        if (_Var19) {
          __range3_7._4_4_ = __range3_7._4_4_ + 1;
          __range3_5._4_4_ = *(ExecutionModel *)((long)opts.fragment + 0x20);
        }
      }
      if (__range3_7._4_4_ == 0) {
        uVar30 = std::__cxx11::string::c_str();
        fprintf(pFVar17,"There is no entry point with name: %s\n",uVar30);
        exit(1);
      }
      if (1 < __range3_7._4_4_) {
        uVar30 = std::__cxx11::string::c_str();
        fprintf(pFVar17,"There is more than one entry point with name: %s. Use --stage.\n",uVar30);
        exit(1);
      }
    }
  }
  uVar28 = std::__cxx11::string::empty();
  if ((uVar28 & 1) == 0) {
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    spirv_cross::Compiler::set_entry_point
              (&pCVar26->super_Compiler,(string *)local_b40,__range3_5._4_4_);
  }
  if (((ulong)spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish & 0x10000000000) == 0) {
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    pOVar32 = spirv_cross::CompilerGLSL::get_common_options(pCVar26);
    if (pOVar32->version == 0) {
      fprintf(_stderr,"Didn\'t specify GLSL version and SPIR-V did not specify language.\n");
      print_help();
      exit(1);
    }
  }
  pCVar26 = std::
            unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
            operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                        *)&stack0xfffffffffffff7c8);
  pOVar32 = spirv_cross::CompilerGLSL::get_common_options(pCVar26);
  __range1_1._4_4_ = pOVar32->version;
  uVar4 = pOVar32->es;
  uVar6 = pOVar32->force_temporary;
  uVar10 = pOVar32->vulkan_semantics;
  uVar14 = pOVar32->separate_shader_objects;
  uVar12 = CONCAT11(uVar14,uVar10);
  uVar8 = CONCAT21(uVar12,uVar6);
  unique0x00012004 = CONCAT31(uVar8,uVar4);
  uVar30._0_1_ = (pOVar32->vertex).fixup_clipspace;
  uVar30._1_1_ = (pOVar32->vertex).flip_vert_y;
  uVar30._2_1_ = (pOVar32->vertex).support_nonzero_base_instance;
  uVar30._3_1_ = pOVar32->field_0x13;
  uVar30._4_4_ = (pOVar32->fragment).default_float_precision;
  opts._16_4_ = (pOVar32->fragment).default_int_precision;
  if (((ulong)spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish & 0x10000000000) != 0) {
    stack0xfffffffffffff42c =
         CONCAT44(unique0x00012004,
                  *(undefined4 *)
                   &spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (((ulong)spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    stack0xfffffffffffff42c =
         CONCAT14(*(undefined1 *)
                   ((long)&spirv_file[1].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 4),__range1_1._4_4_) & 0x1ffffffff;
    stack0xfffffffffffff42c = (ulong)stack0xfffffffffffff42c;
  }
  stack0xfffffffffffff42c =
       CONCAT15(*(undefined1 *)
                 ((long)&spirv_file[1].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 2),stack0xfffffffffffff42c) &
       0x1ffffffffff;
  stack0xfffffffffffff42c = (uint7)stack0xfffffffffffff42c;
  stack0xfffffffffffff42c =
       CONCAT17(*(undefined1 *)
                 ((long)&spirv_file[1].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6),stack0xfffffffffffff42c) &
       0x1ffffffffffffff;
  stack0xfffffffffffff42c =
       CONCAT17(uStack_bd0._3_1_,
                CONCAT16(*(undefined1 *)
                          ((long)&spirv_file[0xac].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 4),
                         stack0xfffffffffffff42c)) & 0xff01ffffffffffff;
  opts._9_7_ = SUB87((ulong)uVar30 >> 8,0);
  opts._8_8_ = CONCAT71(opts._9_7_,
                        *(undefined1 *)
                         ((long)&spirv_file[1].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4)) &
               0xffffffffffffff01;
  opts._8_8_ = CONCAT62(opts._10_6_,
                        CONCAT11(*(undefined1 *)
                                  ((long)&spirv_file[1].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 5),
                                 opts.flatten_multidimensional_arrays)) & 0xffffffffffff01ff;
  opts._8_8_ = CONCAT53(opts._11_5_,
                        CONCAT12(*(undefined1 *)
                                  ((long)&spirv_file[1].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                                 opts._8_2_)) & 0xffffffffff01ffff;
  opts.version = CONCAT13(*(undefined1 *)
                           ((long)&spirv_file[3].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 2),
                          CONCAT12(*(undefined1 *)
                                    ((long)&spirv_file[3].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + 1),
                                   *(undefined2 *)
                                    ((long)&spirv_file[0xac].
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 5))) &
                 0x1010101;
  opts._0_7_ = CONCAT34(0,opts.version);
  opts._0_8_ = CONCAT17(*(undefined1 *)
                         ((long)&spirv_file[3].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 3),opts._0_7_) &
               0x1ffffffffffffff;
  opts._0_8_ = CONCAT35(opts._5_3_,
                        CONCAT14(*(undefined1 *)
                                  ((long)&spirv_file[7].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 1),
                                 opts.version)) & 0xffffff01ffffffff;
  opts._0_8_ = CONCAT26(opts._6_2_,
                        CONCAT15(*(undefined1 *)
                                  ((long)&spirv_file[7].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 2),opts._0_5_
                                )) & 0xffff01ffffffffff;
  opts._0_8_ = CONCAT17(opts.separate_shader_objects,
                        CONCAT16(*(undefined1 *)
                                  ((long)&spirv_file[7].
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 3),opts._0_6_
                                )) & 0xff01ffffffffffff;
  pCVar26 = std::
            unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
            operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                        *)&stack0xfffffffffffff7c8);
  spirv_cross::CompilerGLSL::set_common_options(pCVar26,(Options *)((long)&__range1_1 + 4));
  ppuVar23 = &spirv_file[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  __end1_1 = spirv_cross::VectorView<std::pair<unsigned_int,_unsigned_int>_>::begin
                       ((VectorView<std::pair<unsigned_int,_unsigned_int>_> *)ppuVar23);
  ppVar33 = spirv_cross::VectorView<std::pair<unsigned_int,_unsigned_int>_>::end
                      ((VectorView<std::pair<unsigned_int,_unsigned_int>_> *)ppuVar23);
  for (; __end1_1 != ppVar33; __end1_1 = __end1_1 + 1) {
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    spirv_cross::CompilerGLSL::remap_ext_framebuffer_fetch(pCVar26,__end1_1->first,__end1_1->second)
    ;
  }
  if (((ulong)spirv_file[0xab].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0) {
    hlsl_opts._4_8_ =
         std::unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
         ::get((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                *)&stack0xfffffffffffff7c8);
    pOVar34 = spirv_cross::CompilerHLSL::get_hlsl_options((CompilerHLSL *)hlsl_opts._4_8_);
    auStack_c0c = (undefined1  [4])pOVar34->shader_model;
    uVar5 = pOVar34->point_size_compat;
    uVar7 = pOVar34->point_coord_compat;
    uVar11 = pOVar34->support_nonzero_base_vertex_base_instance;
    uVar15 = pOVar34->force_storage_buffer_as_uav;
    uVar13 = CONCAT11(uVar15,uVar11);
    uVar9 = CONCAT21(uVar13,uVar7);
    unique0x00012004 = CONCAT31(uVar9,uVar5);
    hlsl_opts.shader_model._0_1_ = pOVar34->nonwritable_uav_texture_as_srv;
    uVar1 = pOVar34->enable_16bit_types;
    uVar2 = *(undefined2 *)&pOVar34->field_0xa;
    hlsl_opts.shader_model._1_3_ = CONCAT21(uVar2,uVar1);
    if (((ulong)spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish & 0x1000000000000) != 0) {
      if (*(uint *)((long)&spirv_file[1].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 4) < 0x1e) {
        fprintf(_stderr,"Shader model earlier than 30 (3.0) not supported.\n");
        exit(1);
      }
      _auStack_c0c = CONCAT44(unique0x00012004,
                              *(undefined4 *)
                               ((long)&spirv_file[1].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4));
    }
    if (((ulong)spirv_file[0xab].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) {
      _auStack_c0c = CONCAT15(1,CONCAT14(true,auStack_c0c));
      _auStack_c0c = (ulong)_auStack_c0c;
    }
    if ((uint)auStack_c0c < 0x1f) {
      local_839 = 1;
      local_83a = 1;
    }
    _auStack_c0c = CONCAT17(*(undefined1 *)
                             ((long)&spirv_file[0xab].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            CONCAT16(*(undefined1 *)
                                      ((long)&spirv_file[0xab].
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 3
                                      ),_auStack_c0c)) & 0x101ffffffffffff;
    uVar16 = CONCAT31(hlsl_opts.shader_model._1_3_,
                      *(undefined1 *)
                       ((long)&spirv_file[0xab].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 5));
    hlsl_opts.shader_model = uVar16 & 0xffffff01;
    hlsl_opts.shader_model =
         CONCAT22(hlsl_opts.shader_model._2_2_,
                  CONCAT11(*(undefined1 *)
                            ((long)&spirv_file[0xab].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                           (undefined1)hlsl_opts.shader_model)) & 0xffff01ff;
    spirv_cross::CompilerHLSL::set_hlsl_options
              ((CompilerHLSL *)hlsl_opts._4_8_,(Options *)auStack_c0c);
    spirv_cross::CompilerHLSL::set_resource_binding_flags
              ((CompilerHLSL *)hlsl_opts._4_8_,
               *(HLSLBindingFlags *)
                &spirv_file[0xac].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  if ((local_83a & 1) != 0) {
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    local_c14 = (uint32_t)
                spirv_cross::Compiler::build_dummy_sampler_for_combined_images
                          (&pCVar26->super_Compiler);
    local_c10 = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&local_c14);
    if (local_c10 != 0) {
      pCVar26 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                              *)&stack0xfffffffffffff7c8);
      spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID(&local_c18,local_c10);
      spirv_cross::Compiler::set_decoration
                (&pCVar26->super_Compiler,local_c18,DecorationDescriptorSet,0);
      pCVar26 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                              *)&stack0xfffffffffffff7c8);
      spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)
                 (res.separate_samplers.stack_storage.aligned_char + 0x17c),local_c10);
      spirv_cross::Compiler::set_decoration
                (&pCVar26->super_Compiler,
                 (ID)res.separate_samplers.stack_storage.aligned_char._380_4_,DecorationBinding,0);
    }
  }
  spirv_cross::ShaderResources::ShaderResources((ShaderResources *)&active._M_h._M_single_bucket);
  if (((ulong)spirv_file[0xac].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x100000000000000) == 0) {
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    spirv_cross::Compiler::get_shader_resources
              ((ShaderResources *)&__range2,&pCVar26->super_Compiler);
    spirv_cross::ShaderResources::operator=
              ((ShaderResources *)&active._M_h._M_single_bucket,(ShaderResources *)&__range2);
    spirv_cross::ShaderResources::~ShaderResources((ShaderResources *)&__range2);
  }
  else {
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    spirv_cross::Compiler::get_active_interface_variables
              ((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                *)local_1f78,&pCVar26->super_Compiler);
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    spirv_cross::Compiler::get_shader_resources
              (&local_3298,&pCVar26->super_Compiler,
               (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                *)local_1f78);
    spirv_cross::ShaderResources::operator=
              ((ShaderResources *)&active._M_h._M_single_bucket,&local_3298);
    spirv_cross::ShaderResources::~ShaderResources(&local_3298);
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::unordered_set(&local_32d0,
                    (unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                     *)local_1f78);
    spirv_cross::Compiler::set_enabled_interface_variables(&pCVar26->super_Compiler,&local_32d0);
    std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::~unordered_set(&local_32d0);
    std::
    unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
    ::~unordered_set((unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
                      *)local_1f78);
  }
  if (((ulong)spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 0x1000000) != 0) {
    this = &active._M_h._M_single_bucket;
    __end2 = spirv_cross::VectorView<spirv_cross::Resource>::begin
                       ((VectorView<spirv_cross::Resource> *)this);
    pRVar35 = spirv_cross::VectorView<spirv_cross::Resource>::end
                        ((VectorView<spirv_cross::Resource> *)this);
    for (; __end2 != pRVar35; __end2 = __end2 + 1) {
      pCVar26 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                              *)&stack0xfffffffffffff7c8);
      TVar20 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end2);
      spirv_cross::CompilerGLSL::flatten_buffer_block(pCVar26,(VariableID)TVar20.id);
    }
    this_02 = (VectorView<spirv_cross::Resource> *)
              (res.acceleration_structures.stack_storage.aligned_char + 0x178);
    __end2_1 = spirv_cross::VectorView<spirv_cross::Resource>::begin(this_02);
    pRVar35 = spirv_cross::VectorView<spirv_cross::Resource>::end(this_02);
    for (; __end2_1 != pRVar35; __end2_1 = __end2_1 + 1) {
      pCVar26 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                              *)&stack0xfffffffffffff7c8);
      TVar20 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end2_1);
      spirv_cross::CompilerGLSL::flatten_buffer_block(pCVar26,(VariableID)TVar20.id);
    }
  }
  remap_pls((vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)
            &pls_outputs.
             super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
            (SmallVector<PLSArg,_8UL> *)(spirv_file + 0x1a),
            (SmallVector<spirv_cross::Resource,_8UL> *)
            (res.storage_buffers.stack_storage.aligned_char + 0x178),
            (SmallVector<spirv_cross::Resource,_8UL> *)
            (res.stage_outputs.stack_storage.aligned_char + 0x178));
  remap_pls((vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)local_4670,
            (SmallVector<PLSArg,_8UL> *)
            &spirv_file[0x28].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish,
            (SmallVector<spirv_cross::Resource,_8UL> *)
            (res.stage_inputs.stack_storage.aligned_char + 0x178),
            (SmallVector<spirv_cross::Resource,_8UL> *)0x0);
  pCVar26 = std::
            unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
            operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                        *)&stack0xfffffffffffff7c8);
  std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::vector
            (&local_4688,
             (vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)
             &pls_outputs.
              super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::vector
            ((vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)&__range1_2,
             (vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)local_4670);
  spirv_cross::CompilerGLSL::remap_pixel_local_storage
            (pCVar26,&local_4688,
             (vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)&__range1_2);
  std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::~vector
            ((vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)&__range1_2);
  std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::~vector(&local_4688);
  __begin1_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &spirv_file[0x4f].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_2 = spirv_cross::
             VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__begin1_2);
  ext = spirv_cross::
        VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::end((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__begin1_2);
  for (; __end1_2 != ext; __end1_2 = __end1_2 + 0x20) {
    __range1_3 = (SmallVector<Remap,_8UL> *)__end1_2;
    pCVar26 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                            *)&stack0xfffffffffffff7c8);
    spirv_cross::CompilerGLSL::require_extension(pCVar26,(string *)__range1_3);
  }
  __begin1_3 = (Remap *)&spirv_file[0x36].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
  __end1_3 = spirv_cross::VectorView<Remap>::begin((VectorView<Remap> *)__begin1_3);
  remap = spirv_cross::VectorView<Remap>::end((VectorView<Remap> *)__begin1_3);
  for (; __end1_3 != remap; __end1_3 = __end1_3 + 1) {
    __range1_4 = (SmallVector<InterfaceVariableRename,_8UL> *)__end1_3;
    pCVar36 = std::
              unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
              ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                           *)&stack0xfffffffffffff7c8);
    bVar18 = remap_generic(&pCVar36->super_Compiler,
                           (SmallVector<spirv_cross::Resource,_8UL> *)
                           (res.storage_buffers.stack_storage.aligned_char + 0x178),
                           (Remap *)__range1_4);
    if (!bVar18) {
      pCVar36 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                             *)&stack0xfffffffffffff7c8);
      bVar18 = remap_generic(&pCVar36->super_Compiler,
                             (SmallVector<spirv_cross::Resource,_8UL> *)
                             (res.stage_inputs.stack_storage.aligned_char + 0x178),
                             (Remap *)__range1_4);
      if (!bVar18) {
        pCVar36 = std::
                  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                  ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                               *)&stack0xfffffffffffff7c8);
        remap_generic(&pCVar36->super_Compiler,
                      (SmallVector<spirv_cross::Resource,_8UL> *)
                      (res.stage_outputs.stack_storage.aligned_char + 0x178),(Remap *)__range1_4);
      }
    }
  }
  __begin1_4 = (InterfaceVariableRename *)
               &spirv_file[0x71].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_4 = spirv_cross::VectorView<InterfaceVariableRename>::begin
                       ((VectorView<InterfaceVariableRename> *)__begin1_4);
  rename_1 = spirv_cross::VectorView<InterfaceVariableRename>::end
                       ((VectorView<InterfaceVariableRename> *)__begin1_4);
  do {
    if (__end1_4 == rename_1) {
      if ((local_839 & 1) != 0) {
        pCVar26 = std::
                  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                  ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                                *)&stack0xfffffffffffff7c8);
        spirv_cross::Compiler::build_combined_image_samplers(&pCVar26->super_Compiler);
        if (((ulong)spirv_file[0xac].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
          pCVar36 = std::
                    unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                    ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                                 *)&stack0xfffffffffffff7c8);
          spirv_cross_util::inherit_combined_sampler_bindings(&pCVar36->super_Compiler);
        }
        pCVar26 = std::
                  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                  ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                                *)&stack0xfffffffffffff7c8);
        __begin2_2 = (CombinedImageSampler *)
                     spirv_cross::Compiler::get_combined_image_samplers(&pCVar26->super_Compiler);
        __end2_2 = spirv_cross::VectorView<spirv_cross::CombinedImageSampler>::begin
                             ((VectorView<spirv_cross::CombinedImageSampler> *)__begin2_2);
        remap_1 = spirv_cross::VectorView<spirv_cross::CombinedImageSampler>::end
                            ((VectorView<spirv_cross::CombinedImageSampler> *)__begin2_2);
        for (; __end2_2 != remap_1; __end2_2 = __end2_2 + 1) {
          local_4720 = __end2_2;
          pCVar26 = std::
                    unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                    ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                                  *)&stack0xfffffffffffff7c8);
          spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                    (&local_4724,&local_4720->combined_id);
          pCVar37 = std::
                    unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                    ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                                  *)&stack0xfffffffffffff7c8);
          spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                    ((TypedID<(spirv_cross::Types)0> *)((long)&hlsl_compiler + 4),
                     &local_4720->image_id);
          ts_1 = spirv_cross::Compiler::get_name_abi_cxx11_
                           (&pCVar37->super_Compiler,hlsl_compiler._4_4_);
          pCVar37 = std::
                    unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                    ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                                  *)&stack0xfffffffffffff7c8);
          spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                    ((TypedID<(spirv_cross::Types)0> *)&hlsl_compiler,&local_4720->sampler_id);
          ts_2 = spirv_cross::Compiler::get_name_abi_cxx11_
                           (&pCVar37->super_Compiler,hlsl_compiler._0_4_);
          spirv_cross::
          join<char_const(&)[21],std::__cxx11::string_const&,std::__cxx11::string_const&>
                    (local_4748,(char (*) [21])"SPIRV_Cross_Combined",ts_1,ts_2);
          spirv_cross::Compiler::set_name(&pCVar26->super_Compiler,local_4724,(string *)local_4748);
          std::__cxx11::string::~string((string *)local_4748);
        }
      }
      if (((ulong)spirv_file[0xab].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0) {
        pCStack_4758 = (CompilerHLSL *)
                       std::
                       unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                       ::get((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                              *)&stack0xfffffffffffff7c8);
        local_4760 = (uint32_t)spirv_cross::CompilerHLSL::remap_num_workgroups_builtin(pCStack_4758)
        ;
        local_475c = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&local_4760);
        pCVar39 = pCStack_4758;
        if (local_475c != 0) {
          spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)((long)&__range2_3 + 4),local_475c);
          spirv_cross::Compiler::set_decoration
                    ((Compiler *)pCVar39,__range2_3._4_4_,DecorationDescriptorSet,0);
          pCVar39 = pCStack_4758;
          spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)&__range2_3,local_475c);
          spirv_cross::Compiler::set_decoration
                    ((Compiler *)pCVar39,__range2_3._0_4_,DecorationBinding,0);
        }
      }
      if (((ulong)spirv_file[0xab].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0) {
        __end2_3 = spirv_cross::VectorView<spirv_cross::HLSLVertexAttributeRemap>::begin
                             ((VectorView<spirv_cross::HLSLVertexAttributeRemap> *)
                              (spirv_file + 0x80));
        pHVar38 = spirv_cross::VectorView<spirv_cross::HLSLVertexAttributeRemap>::end
                            ((VectorView<spirv_cross::HLSLVertexAttributeRemap> *)
                             (spirv_file + 0x80));
        for (; __end2_3 != pHVar38; __end2_3 = __end2_3 + 1) {
          pCVar39 = (CompilerHLSL *)
                    std::
                    unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                    ::get((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                           *)&stack0xfffffffffffff7c8);
          spirv_cross::CompilerHLSL::add_vertex_attribute_remap(pCVar39,__end2_3);
        }
      }
      pCVar26 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator->((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                              *)&stack0xfffffffffffff7c8);
      (*(pCVar26->super_Compiler)._vptr_Compiler[2])(args);
      if (((ulong)spirv_file[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0) {
        pCVar36 = std::
                  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                  ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                               *)&stack0xfffffffffffff7c8);
        print_resources(&pCVar36->super_Compiler,(ShaderResources *)&active._M_h._M_single_bucket);
        pCVar36 = std::
                  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                  ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                               *)&stack0xfffffffffffff7c8);
        print_push_constant_resources
                  (&pCVar36->super_Compiler,
                   (SmallVector<spirv_cross::Resource,_8UL> *)
                   (res.acceleration_structures.stack_storage.aligned_char + 0x178));
        pCVar36 = std::
                  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                  ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                               *)&stack0xfffffffffffff7c8);
        print_spec_constants(&pCVar36->super_Compiler);
        pCVar36 = std::
                  unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                  ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                               *)&stack0xfffffffffffff7c8);
        print_capabilities_and_extensions(&pCVar36->super_Compiler);
      }
      std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::~vector
                ((vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)local_4670
                );
      std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::~vector
                ((vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)
                 &pls_outputs.
                  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      spirv_cross::ShaderResources::~ShaderResources
                ((ShaderResources *)&active._M_h._M_single_bucket);
      std::__cxx11::string::~string(local_b40);
      spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::EntryPoint,_8UL> *)local_b20);
      std::unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>::
      ~unique_ptr((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                   *)&stack0xfffffffffffff7c8);
      spirv_cross::Parser::~Parser((Parser *)local_808);
      return args;
    }
    __range2_2 = (SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)__end1_4;
    if (__end1_4->storageClass == StorageClassInput) {
      pCVar36 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                             *)&stack0xfffffffffffff7c8);
      spirv_cross_util::rename_interface_variable
                (&pCVar36->super_Compiler,
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.storage_buffers.stack_storage.aligned_char + 0x178),
                 *(uint32_t *)
                  ((long)&(__range2_2->super_VectorView<spirv_cross::CombinedImageSampler>).ptr + 4)
                 ,(string *)
                  &(__range2_2->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size);
    }
    else {
      if (__end1_4->storageClass != StorageClassOutput) {
        fprintf(_stderr,"error at --rename-interface-variable <in|out> ...\n");
        exit(1);
      }
      pCVar36 = std::
                unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                ::operator*((unique_ptr<spirv_cross::CompilerGLSL,_std::default_delete<spirv_cross::CompilerGLSL>_>
                             *)&stack0xfffffffffffff7c8);
      spirv_cross_util::rename_interface_variable
                (&pCVar36->super_Compiler,
                 (SmallVector<spirv_cross::Resource,_8UL> *)
                 (res.stage_inputs.stack_storage.aligned_char + 0x178),
                 *(uint32_t *)
                  ((long)&(__range2_2->super_VectorView<spirv_cross::CombinedImageSampler>).ptr + 4)
                 ,(string *)
                  &(__range2_2->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size);
    }
    __end1_4 = __end1_4 + 1;
  } while( true );
}

Assistant:

static string compile_iteration(const CLIArguments &args, std::vector<uint32_t> spirv_file)
{
	Parser spirv_parser(move(spirv_file));
	spirv_parser.parse();

	unique_ptr<CompilerGLSL> compiler;
	bool combined_image_samplers = false;
	bool build_dummy_sampler = false;

	if (args.cpp)
	{
		compiler.reset(new CompilerCPP(move(spirv_parser.get_parsed_ir())));
		if (args.cpp_interface_name)
			static_cast<CompilerCPP *>(compiler.get())->set_interface_name(args.cpp_interface_name);
	}
	else if (args.msl)
	{
		compiler.reset(new CompilerMSL(move(spirv_parser.get_parsed_ir())));

		auto *msl_comp = static_cast<CompilerMSL *>(compiler.get());
		auto msl_opts = msl_comp->get_msl_options();
		if (args.set_msl_version)
			msl_opts.msl_version = args.msl_version;
		msl_opts.capture_output_to_buffer = args.msl_capture_output_to_buffer;
		msl_opts.swizzle_texture_samples = args.msl_swizzle_texture_samples;
		msl_opts.invariant_float_math = args.msl_invariant_float_math;
		if (args.msl_ios)
		{
			msl_opts.platform = CompilerMSL::Options::iOS;
			msl_opts.ios_use_framebuffer_fetch_subpasses = args.msl_framebuffer_fetch;
			msl_opts.emulate_cube_array = args.msl_emulate_cube_array;
		}
		msl_opts.pad_fragment_output_components = args.msl_pad_fragment_output;
		msl_opts.tess_domain_origin_lower_left = args.msl_domain_lower_left;
		msl_opts.argument_buffers = args.msl_argument_buffers;
		msl_opts.texture_buffer_native = args.msl_texture_buffer_native;
		msl_opts.multiview = args.msl_multiview;
		msl_opts.multiview_layered_rendering = args.msl_multiview_layered_rendering;
		msl_opts.view_index_from_device_index = args.msl_view_index_from_device_index;
		msl_opts.dispatch_base = args.msl_dispatch_base;
		msl_opts.enable_decoration_binding = args.msl_decoration_binding;
		msl_opts.force_active_argument_buffer_resources = args.msl_force_active_argument_buffer_resources;
		msl_opts.force_native_arrays = args.msl_force_native_arrays;
		msl_opts.enable_frag_depth_builtin = args.msl_enable_frag_depth_builtin;
		msl_opts.enable_frag_stencil_ref_builtin = args.msl_enable_frag_stencil_ref_builtin;
		msl_opts.enable_frag_output_mask = args.msl_enable_frag_output_mask;
		msl_opts.enable_clip_distance_user_varying = args.msl_enable_clip_distance_user_varying;
		msl_opts.multi_patch_workgroup = args.msl_multi_patch_workgroup;
		msl_opts.vertex_for_tessellation = args.msl_vertex_for_tessellation;
		msl_opts.additional_fixed_sample_mask = args.msl_additional_fixed_sample_mask;
		msl_opts.arrayed_subpass_input = args.msl_arrayed_subpass_input;
		msl_comp->set_msl_options(msl_opts);
		for (auto &v : args.msl_discrete_descriptor_sets)
			msl_comp->add_discrete_descriptor_set(v);
		for (auto &v : args.msl_device_argument_buffers)
			msl_comp->set_argument_buffer_device_address_space(v, true);
		uint32_t i = 0;
		for (auto &v : args.msl_dynamic_buffers)
			msl_comp->add_dynamic_buffer(v.first, v.second, i++);
		for (auto &v : args.msl_inline_uniform_blocks)
			msl_comp->add_inline_uniform_block(v.first, v.second);
		for (auto &v : args.msl_shader_inputs)
			msl_comp->add_msl_shader_input(v);
	}
	else if (args.hlsl)
		compiler.reset(new CompilerHLSL(move(spirv_parser.get_parsed_ir())));
	else
	{
		combined_image_samplers = !args.vulkan_semantics;
		if (!args.vulkan_semantics || args.vulkan_glsl_disable_ext_samplerless_texture_functions)
			build_dummy_sampler = true;
		compiler.reset(new CompilerGLSL(move(spirv_parser.get_parsed_ir())));
	}

	if (!args.variable_type_remaps.empty())
	{
		auto remap_cb = [&](const SPIRType &, const string &name, string &out) -> void {
			for (const VariableTypeRemap &remap : args.variable_type_remaps)
				if (name == remap.variable_name)
					out = remap.new_variable_type;
		};

		compiler->set_variable_type_remap_callback(move(remap_cb));
	}

	for (auto &rename : args.entry_point_rename)
		compiler->rename_entry_point(rename.old_name, rename.new_name, rename.execution_model);

	auto entry_points = compiler->get_entry_points_and_stages();
	auto entry_point = args.entry;
	ExecutionModel model = ExecutionModelMax;

	if (!args.entry_stage.empty())
	{
		model = stage_to_execution_model(args.entry_stage);
		if (entry_point.empty())
		{
			// Just use the first entry point with this stage.
			for (auto &e : entry_points)
			{
				if (e.execution_model == model)
				{
					entry_point = e.name;
					break;
				}
			}

			if (entry_point.empty())
			{
				fprintf(stderr, "Could not find an entry point with stage: %s\n", args.entry_stage.c_str());
				exit(EXIT_FAILURE);
			}
		}
		else
		{
			// Make sure both stage and name exists.
			bool exists = false;
			for (auto &e : entry_points)
			{
				if (e.execution_model == model && e.name == entry_point)
				{
					exists = true;
					break;
				}
			}

			if (!exists)
			{
				fprintf(stderr, "Could not find an entry point %s with stage: %s\n", entry_point.c_str(),
				        args.entry_stage.c_str());
				exit(EXIT_FAILURE);
			}
		}
	}
	else if (!entry_point.empty())
	{
		// Make sure there is just one entry point with this name, or the stage
		// is ambiguous.
		uint32_t stage_count = 0;
		for (auto &e : entry_points)
		{
			if (e.name == entry_point)
			{
				stage_count++;
				model = e.execution_model;
			}
		}

		if (stage_count == 0)
		{
			fprintf(stderr, "There is no entry point with name: %s\n", entry_point.c_str());
			exit(EXIT_FAILURE);
		}
		else if (stage_count > 1)
		{
			fprintf(stderr, "There is more than one entry point with name: %s. Use --stage.\n", entry_point.c_str());
			exit(EXIT_FAILURE);
		}
	}

	if (!entry_point.empty())
		compiler->set_entry_point(entry_point, model);

	if (!args.set_version && !compiler->get_common_options().version)
	{
		fprintf(stderr, "Didn't specify GLSL version and SPIR-V did not specify language.\n");
		print_help();
		exit(EXIT_FAILURE);
	}

	CompilerGLSL::Options opts = compiler->get_common_options();
	if (args.set_version)
		opts.version = args.version;
	if (args.set_es)
		opts.es = args.es;
	opts.force_temporary = args.force_temporary;
	opts.separate_shader_objects = args.sso;
	opts.flatten_multidimensional_arrays = args.flatten_multidimensional_arrays;
	opts.enable_420pack_extension = args.use_420pack_extension;
	opts.vulkan_semantics = args.vulkan_semantics;
	opts.vertex.fixup_clipspace = args.fixup;
	opts.vertex.flip_vert_y = args.yflip;
	opts.vertex.support_nonzero_base_instance = args.support_nonzero_baseinstance;
	opts.emit_push_constant_as_uniform_buffer = args.glsl_emit_push_constant_as_ubo;
	opts.emit_uniform_buffer_as_plain_uniforms = args.glsl_emit_ubo_as_plain_uniforms;
	opts.force_flattened_io_blocks = args.glsl_force_flattened_io_blocks;
	opts.emit_line_directives = args.emit_line_directives;
	opts.enable_storage_image_qualifier_deduction = args.enable_storage_image_qualifier_deduction;
	opts.force_zero_initialized_variables = args.force_zero_initialized_variables;
	compiler->set_common_options(opts);

	for (auto &fetch : args.glsl_ext_framebuffer_fetch)
		compiler->remap_ext_framebuffer_fetch(fetch.first, fetch.second);

	// Set HLSL specific options.
	if (args.hlsl)
	{
		auto *hlsl = static_cast<CompilerHLSL *>(compiler.get());
		auto hlsl_opts = hlsl->get_hlsl_options();
		if (args.set_shader_model)
		{
			if (args.shader_model < 30)
			{
				fprintf(stderr, "Shader model earlier than 30 (3.0) not supported.\n");
				exit(EXIT_FAILURE);
			}

			hlsl_opts.shader_model = args.shader_model;
		}

		if (args.hlsl_compat)
		{
			// Enable all compat options.
			hlsl_opts.point_size_compat = true;
			hlsl_opts.point_coord_compat = true;
		}

		if (hlsl_opts.shader_model <= 30)
		{
			combined_image_samplers = true;
			build_dummy_sampler = true;
		}

		hlsl_opts.support_nonzero_base_vertex_base_instance = args.hlsl_support_nonzero_base;
		hlsl_opts.force_storage_buffer_as_uav = args.hlsl_force_storage_buffer_as_uav;
		hlsl_opts.nonwritable_uav_texture_as_srv = args.hlsl_nonwritable_uav_texture_as_srv;
		hlsl_opts.enable_16bit_types = args.hlsl_enable_16bit_types;
		hlsl->set_hlsl_options(hlsl_opts);
		hlsl->set_resource_binding_flags(args.hlsl_binding_flags);
	}

	if (build_dummy_sampler)
	{
		uint32_t sampler = compiler->build_dummy_sampler_for_combined_images();
		if (sampler != 0)
		{
			// Set some defaults to make validation happy.
			compiler->set_decoration(sampler, DecorationDescriptorSet, 0);
			compiler->set_decoration(sampler, DecorationBinding, 0);
		}
	}

	ShaderResources res;
	if (args.remove_unused)
	{
		auto active = compiler->get_active_interface_variables();
		res = compiler->get_shader_resources(active);
		compiler->set_enabled_interface_variables(move(active));
	}
	else
		res = compiler->get_shader_resources();

	if (args.flatten_ubo)
	{
		for (auto &ubo : res.uniform_buffers)
			compiler->flatten_buffer_block(ubo.id);
		for (auto &ubo : res.push_constant_buffers)
			compiler->flatten_buffer_block(ubo.id);
	}

	auto pls_inputs = remap_pls(args.pls_in, res.stage_inputs, &res.subpass_inputs);
	auto pls_outputs = remap_pls(args.pls_out, res.stage_outputs, nullptr);
	compiler->remap_pixel_local_storage(move(pls_inputs), move(pls_outputs));

	for (auto &ext : args.extensions)
		compiler->require_extension(ext);

	for (auto &remap : args.remaps)
	{
		if (remap_generic(*compiler, res.stage_inputs, remap))
			continue;
		if (remap_generic(*compiler, res.stage_outputs, remap))
			continue;
		if (remap_generic(*compiler, res.subpass_inputs, remap))
			continue;
	}

	for (auto &rename : args.interface_variable_renames)
	{
		if (rename.storageClass == StorageClassInput)
			spirv_cross_util::rename_interface_variable(*compiler, res.stage_inputs, rename.location,
			                                            rename.variable_name);
		else if (rename.storageClass == StorageClassOutput)
			spirv_cross_util::rename_interface_variable(*compiler, res.stage_outputs, rename.location,
			                                            rename.variable_name);
		else
		{
			fprintf(stderr, "error at --rename-interface-variable <in|out> ...\n");
			exit(EXIT_FAILURE);
		}
	}

	if (combined_image_samplers)
	{
		compiler->build_combined_image_samplers();
		if (args.combined_samplers_inherit_bindings)
			spirv_cross_util::inherit_combined_sampler_bindings(*compiler);

		// Give the remapped combined samplers new names.
		for (auto &remap : compiler->get_combined_image_samplers())
		{
			compiler->set_name(remap.combined_id, join("SPIRV_Cross_Combined", compiler->get_name(remap.image_id),
			                                           compiler->get_name(remap.sampler_id)));
		}
	}

	if (args.hlsl)
	{
		auto *hlsl_compiler = static_cast<CompilerHLSL *>(compiler.get());
		uint32_t new_builtin = hlsl_compiler->remap_num_workgroups_builtin();
		if (new_builtin)
		{
			hlsl_compiler->set_decoration(new_builtin, DecorationDescriptorSet, 0);
			hlsl_compiler->set_decoration(new_builtin, DecorationBinding, 0);
		}
	}

	if (args.hlsl)
	{
		for (auto &remap : args.hlsl_attr_remap)
			static_cast<CompilerHLSL *>(compiler.get())->add_vertex_attribute_remap(remap);
	}

	auto ret = compiler->compile();

	if (args.dump_resources)
	{
		print_resources(*compiler, res);
		print_push_constant_resources(*compiler, res.push_constant_buffers);
		print_spec_constants(*compiler);
		print_capabilities_and_extensions(*compiler);
	}

	return ret;
}